

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O2

float __thiscall DBSCAN::GetDistance(DBSCAN *this,Embedding *emb1,Embedding *emb2)

{
  float fVar1;
  float fVar2;
  double dVar3;
  long lVar4;
  double dVar5;
  float local_a4;
  float local_98;
  float fStack_94;
  _Vector_base<float,_std::allocator<float>_> local_88;
  _Vector_base<float,_std::allocator<float>_> local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  local_98 = 0.0;
  fStack_94 = 0.0;
  local_a4 = 0.0;
  for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 1) {
    Embedding::GetEmb((vector<float,_std::allocator<float>_> *)&local_88,emb1);
    fVar1 = local_88._M_impl.super__Vector_impl_data._M_start[lVar4];
    Embedding::GetEmb((vector<float,_std::allocator<float>_> *)&local_70,emb2);
    fVar2 = local_70._M_impl.super__Vector_impl_data._M_start[lVar4];
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_70);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_88);
    Embedding::GetEmb((vector<float,_std::allocator<float>_> *)&local_88,emb1);
    local_38 = ZEXT416((uint)local_88._M_impl.super__Vector_impl_data._M_start[lVar4]);
    Embedding::GetEmb((vector<float,_std::allocator<float>_> *)&local_70,emb1);
    local_48 = ZEXT416((uint)local_70._M_impl.super__Vector_impl_data._M_start[lVar4]);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_70);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_88);
    Embedding::GetEmb((vector<float,_std::allocator<float>_> *)&local_88,emb2);
    local_58 = ZEXT416((uint)local_88._M_impl.super__Vector_impl_data._M_start[lVar4]);
    Embedding::GetEmb((vector<float,_std::allocator<float>_> *)&local_70,emb2);
    local_a4 = local_a4 + fVar1 * fVar2;
    local_98 = local_98 +
               local_70._M_impl.super__Vector_impl_data._M_start[lVar4] * (float)local_58._0_4_;
    fStack_94 = fStack_94 + (float)local_48._0_4_ * (float)local_38._0_4_;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_70);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_88);
  }
  dVar5 = (double)fStack_94;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar3 = (double)local_98;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  return (float)((double)local_a4 / (dVar5 * dVar3));
}

Assistant:

float DBSCAN::GetDistance(Embedding emb1, Embedding emb2)
{
    float f1dis = 0;
    float f2dis = 0;
    float f1f2dis = 0;
    for (size_t i = 0; i < EMB_SIZE; i++)
    {
        f1f2dis += (float)emb1.GetEmb()[i] * (float)emb2.GetEmb()[i];
        f1dis += (float)emb1.GetEmb()[i] * (float)emb1.GetEmb()[i];
        f2dis += (float)emb2.GetEmb()[i] * (float)emb2.GetEmb()[i];
    }

    float distance = f1f2dis / (sqrt(f1dis) * sqrt(f2dis));
    return distance;        //开方并返回距离
}